

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::filldata<const_char16_t[1]>::fill(ostream *stream,char16_t (*in) [1])

{
  anon_union_24_2_13149d16_for_String_3 local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  local_20.buf[0x17] = '\x14';
  local_20._0_4_ = 0x7d3f7b;
  doctest::operator<<(stream,(String *)&local_20.data);
  if ((local_20.buf[0x17] < '\0') &&
     ((void *)CONCAT44(local_20._4_4_,local_20._0_4_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT44(local_20._4_4_,local_20._0_4_));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  return;
}

Assistant:

static void fill(std::ostream* stream, const T(&in)[N]) {
            *stream << "[";
            for (size_t i = 0; i < N; i++) {
                if (i != 0) { *stream << ", "; }
                *stream << (DOCTEST_STRINGIFY(in[i]));
            }
            *stream << "]";
        }